

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Mode5InterrogatorBasicData.cpp
# Opt level: O0

KString * __thiscall
KDIS::DATA_TYPE::Mode5InterrogatorBasicData::GetAsString_abi_cxx11_
          (KString *__return_storage_ptr__,Mode5InterrogatorBasicData *this)

{
  ostream *poVar1;
  KString local_258;
  KString local_238;
  _Base_bitset<1UL> local_218;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_210;
  KString local_1f0;
  KString local_1d0;
  stringstream local_1a0 [8];
  KStringStream ss;
  ostream local_190 [376];
  Mode5InterrogatorBasicData *local_18;
  Mode5InterrogatorBasicData *this_local;
  
  local_18 = this;
  this_local = (Mode5InterrogatorBasicData *)__return_storage_ptr__;
  std::__cxx11::stringstream::stringstream(local_1a0);
  poVar1 = std::operator<<(local_190,"Mode 5 Interrogator Basic Data:");
  Mode5InterrogatorStatus::GetAsString_abi_cxx11_(&local_1f0,&this->m_Status);
  UTILS::IndentString(&local_1d0,&local_1f0,1,'\t');
  poVar1 = std::operator<<(poVar1,(string *)&local_1d0);
  local_218._M_w = (_WordT)GetMessageFormatsPresentBitSet(this);
  std::bitset<32ul>::to_string_abi_cxx11_(&local_210,(bitset<32ul> *)&local_218);
  poVar1 = std::operator<<(poVar1,(string *)&local_210);
  EntityIdentifier::GetAsString_abi_cxx11_(&local_258,&this->m_InterrogatedID);
  UTILS::IndentString(&local_238,&local_258,1,'\t');
  std::operator<<(poVar1,(string *)&local_238);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_210);
  std::__cxx11::string::~string((string *)&local_1d0);
  std::__cxx11::string::~string((string *)&local_1f0);
  std::__cxx11::stringstream::str();
  std::__cxx11::stringstream::~stringstream(local_1a0);
  return __return_storage_ptr__;
}

Assistant:

KString Mode5InterrogatorBasicData::GetAsString() const
{
    KStringStream ss;	
	ss << "Mode 5 Interrogator Basic Data:"
       << IndentString( m_Status.GetAsString() )
	   << GetMessageFormatsPresentBitSet().to_string()
	   << IndentString( m_InterrogatedID.GetAsString() );	   
	   
    return ss.str();
}